

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptNumber::ToLocaleStringNanOrInfinite(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  UINT cchUseLength;
  JavascriptString *pJVar4;
  undefined4 *puVar5;
  BSTR bstr;
  int32 isz;
  
  bVar2 = NumberUtilities::IsFinite(value);
  if (bVar2) {
    pJVar4 = (JavascriptString *)0x0;
  }
  else {
    BVar3 = IsNan(value);
    if (BVar3 != 0) {
      pJVar4 = ToStringNan(scriptContext);
      return pJVar4;
    }
    bVar2 = IsPosInf(value);
    isz = 6000;
    if (!bVar2) {
      bVar2 = IsNegInf(value);
      isz = 0x1771;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                    ,0x428,"(IsNegInf(value))","bad handling of infinite number");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    bstr = BstrGetResourceString(isz);
    if (bstr == (BSTR)0x0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
    cchUseLength = SysStringLen(bstr);
    pJVar4 = JavascriptString::NewCopyBuffer(bstr,cchUseLength,scriptContext);
    SysFreeString(bstr);
  }
  return pJVar4;
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleStringNanOrInfinite(double value, ScriptContext* scriptContext)
    {
        if (!NumberUtilities::IsFinite(value))
        {
            if (IsNan(value))
            {
                return ToStringNan(scriptContext);
            }

            BSTR bstr = nullptr;
            if (IsPosInf(value))
            {
                bstr = BstrGetResourceString(IDS_INFINITY);
            }
            else
            {
                AssertMsg(IsNegInf(value), "bad handling of infinite number");
                bstr = BstrGetResourceString(IDS_MINUSINFINITY);
            }

            if (bstr == nullptr)
            {
                Js::JavascriptError::ThrowTypeError(scriptContext, VBSERR_InternalError);
            }
            JavascriptString* str = JavascriptString::NewCopyBuffer(bstr, SysStringLen(bstr), scriptContext);
            SysFreeString(bstr);
            return str;
        }
        return nullptr;
    }